

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

complex<float> __thiscall soul::Value::PackedData::getAsComplex32(PackedData *this)

{
  Type *pTVar1;
  
  pTVar1 = this->type;
  if ((pTVar1->primitiveType).type != complex32) {
    getAsComplex64(this);
    return (complex<float>)(_ComplexT)pTVar1;
  }
  if (this->size == 8) {
    return (complex<float>)(_ComplexT)this->data;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
}

Assistant:

std::complex<float> getAsComplex32() const
    {
        if (type.isComplex32())
            return getAs<std::complex<float>>();

        return static_cast<std::complex<float>> (getAsComplex64());
    }